

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::PolygonNumSamplesCase::renderPattern(PolygonNumSamplesCase *this)

{
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  Vec3 local_98;
  Vec3 local_88;
  Vec3 local_78;
  float local_68;
  float local_58;
  Vec4 local_48;
  
  iVar1 = 0;
  do {
    fVar2 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001;
    fVar3 = ((float)iVar1 * 6.2831855) / 25.0 + fVar2;
    fVar2 = (((float)iVar1 + 0.5) * 6.2831855) / 25.0 + fVar2;
    local_58 = cosf(fVar3);
    local_68 = sinf(fVar3);
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    local_48.m_data[0] = 1.0;
    local_48.m_data[1] = 1.0;
    local_48.m_data[2] = 1.0;
    local_48.m_data[3] = 1.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    local_88.m_data[1] = local_68 * (float)0x3f733333;
    local_88.m_data[0] = local_58 * (float)0x3f733333;
    local_88.m_data[2] = 0.0;
    local_98.m_data[1] = fVar2 * (float)0x3f733333;
    local_98.m_data[0] = fVar3 * (float)0x3f733333;
    local_98.m_data[2] = 0.0;
    MultisampleCase::renderTriangle
              ((MultisampleCase *)this,&local_78,&local_88,&local_98,&local_48,&local_48,&local_48);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x19);
  return;
}

Assistant:

void PolygonNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several triangles with edges at different angles.

	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles + 0.001f*(float)m_currentIteration;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles + 0.001f*(float)m_currentIteration;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(1.0f));
	}
}